

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O1

void __thiscall
test_matrix_sparse_lower_bound_Test::TestBody(test_matrix_sparse_lower_bound_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char *pcVar9;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> index_00;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_17;
  Matrix_Sparse matrix_const;
  Matrix_Sparse matrix;
  undefined1 local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_150;
  unsigned_long local_148;
  matrix_type *pmStack_140;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_130;
  size_t local_128;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_110;
  pointer local_108;
  pointer local_100;
  undefined1 local_f8 [8];
  pointer local_f0;
  Matrix_Sparse local_e8;
  size_t local_98 [2];
  Matrix_Sparse local_88;
  Matrix_Sparse *local_38;
  undefined8 uStack_30;
  iterator local_28;
  undefined8 uStack_20;
  
  local_e8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
  local_e8.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_e8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  local_158 = (undefined1  [8])0x1;
  pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_148 = 2;
  local_28 = (iterator)local_138;
  local_138 = (undefined1  [8])&DAT_4008000000000000;
  pbStack_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x4010000000000000;
  local_128 = 0x4014000000000000;
  uStack_20 = 3;
  value._M_len = 3;
  value._M_array = local_28;
  non_zero._M_len = 4;
  non_zero._M_array = (iterator)&local_e8;
  index._M_len = 3;
  index._M_array = (iterator)local_158;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_88,non_zero,index,value,3);
  local_138 = (undefined1  [8])0x0;
  local_118 = (undefined1  [8])0x0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_138,(size_t *)local_118);
  auVar4._12_4_ = 0;
  auVar4._0_12_ = stack0xffffffffffffff0c;
  _local_f8 = (value_type)(auVar4 << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.lower_bound(0, 0).i_row()","0",
             (unsigned_long *)
             &local_e8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_f8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e5,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_138 = (undefined1  [8])0x0;
  local_118 = (undefined1  [8])0x0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_138,(size_t *)local_118);
  local_f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.lower_bound(0, 0).i_column()","1",
             local_e8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_f8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e6,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_138 = (undefined1  [8])0x0;
  local_118 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_138,(size_t *)local_118);
  auVar1._12_4_ = 0;
  auVar1._0_12_ = stack0xffffffffffffff0c;
  _local_f8 = (value_type)(auVar1 << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.lower_bound(0, 1).i_row()","0",
             (unsigned_long *)
             &local_e8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_f8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e7,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_138 = (undefined1  [8])0x0;
  local_118 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_138,(size_t *)local_118);
  local_f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.lower_bound(0, 1).i_column()","1",
             local_e8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_f8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e8,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_f0;
  _local_f8 = (value_type)(auVar5 << 0x40);
  local_100 = (pointer)0x2;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_f8,(size_t *)&local_100);
  local_98[0] = 0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_118,(size_t *)&local_88);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)local_158,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_118);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>>
            ((internal *)local_138,"matrix.lower_bound(0, 2)","matrix[0].end()",
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)&local_e8,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1e9,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_138 = (undefined1  [8])0x1;
  local_118 = (undefined1  [8])0x0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_138,(size_t *)local_118);
  local_f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.lower_bound(1, 0).i_row()","1",
             (unsigned_long *)
             &local_e8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_f8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1eb,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_138 = (undefined1  [8])0x1;
  local_118 = (undefined1  [8])0x0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_138,(size_t *)local_118);
  auVar2._12_4_ = 0;
  auVar2._0_12_ = stack0xffffffffffffff0c;
  _local_f8 = (value_type)(auVar2 << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.lower_bound(1, 0).i_column()","0",
             local_e8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_f8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ec,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_138 = (undefined1  [8])0x1;
  local_118 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_138,(size_t *)local_118);
  local_f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.lower_bound(1, 1).i_row()","1",
             (unsigned_long *)
             &local_e8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_f8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ed,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_138 = (undefined1  [8])0x1;
  local_118 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_138,(size_t *)local_118);
  local_f8._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.lower_bound(1, 1).i_column()","2",
             local_e8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_f8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ee,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_138 = (undefined1  [8])0x1;
  local_118 = (undefined1  [8])0x2;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_138,(size_t *)local_118);
  local_f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.lower_bound(1, 2).i_row()","1",
             (unsigned_long *)
             &local_e8.row_non_zero.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_f8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ef,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_138 = (undefined1  [8])0x1;
  local_118 = (undefined1  [8])0x2;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_138,(size_t *)local_118);
  local_f8._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_158,"matrix.lower_bound(1, 2).i_column()","2",
             local_e8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_f8);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_150 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_150->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f0,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_150,pbStack_150);
  }
  local_f8 = (undefined1  [8])0x2;
  local_100 = (pointer)0x0;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_f8,(size_t *)&local_100);
  local_98[0] = 2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_118,(size_t *)&local_88);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)local_158,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_118);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>>
            ((internal *)local_138,"matrix.lower_bound(2, 0)","matrix[2].end()",
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)&local_e8,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f2,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_f8 = (undefined1  [8])0x3;
  local_100 = (pointer)0x3;
  Disa::Matrix_Sparse::lower_bound
            ((iterator_element *)&local_e8,&local_88,(size_t *)local_f8,(size_t *)&local_100);
  Disa::Matrix_Sparse::end((Matrix_Sparse *)local_118);
  Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)local_158,(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_118);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>>
            ((internal *)local_138,"matrix.lower_bound(3, 3)","matrix.end()->end()",
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)&local_e8,
             (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_158);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,499,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if ((pointer)local_e8.row_non_zero.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_e8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_148 = 3;
  pmStack_140 = (matrix_type *)0x3;
  local_158 = (undefined1  [8])0x0;
  pbStack_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_138 = (undefined1  [8])0x1;
  pbStack_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_128 = 2;
  local_118 = (undefined1  [8])&DAT_4008000000000000;
  pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x4010000000000000;
  local_108 = (pointer)0x4014000000000000;
  uStack_30 = 3;
  value_00._M_len = 3;
  value_00._M_array = (iterator)local_118;
  non_zero_00._M_len = 4;
  non_zero_00._M_array = (iterator)local_158;
  index_00._M_len = 3;
  index_00._M_array = (iterator)local_138;
  local_38 = (Matrix_Sparse *)local_118;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_e8,non_zero_00,index_00,value_00,3);
  local_118 = (undefined1  [8])0x0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_f0;
  _local_f8 = (value_type)(auVar3 << 0x40);
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)local_118,(size_t *)local_f8);
  local_100 = (pointer)((ulong)local_100 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"matrix_const.lower_bound(0, 0).i_row()","0",&local_148,
             (int *)&local_100);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f6,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_118 = (undefined1  [8])0x0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_f0;
  _local_f8 = (value_type)(auVar6 << 0x40);
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)local_118,(size_t *)local_f8);
  local_100 = (pointer)CONCAT44(local_100._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"matrix_const.lower_bound(0, 0).i_column()","1",
             (unsigned_long *)local_158,(int *)&local_100);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f7,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_118 = (undefined1  [8])0x0;
  local_f8 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)local_118,(size_t *)local_f8);
  local_100 = (pointer)((ulong)local_100 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"matrix_const.lower_bound(0, 1).i_row()","0",&local_148,
             (int *)&local_100);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f8,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_118 = (undefined1  [8])0x0;
  local_f8 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)local_118,(size_t *)local_f8);
  local_100 = (pointer)CONCAT44(local_100._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"matrix_const.lower_bound(0, 1).i_column()","1",
             (unsigned_long *)local_158,(int *)&local_100);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1f9,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_100 = (pointer)0x0;
  local_98[0] = 2;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)&local_100,local_98);
  local_98[1] = 0;
  _local_f8 = Disa::Matrix_Sparse::operator[](&local_e8,local_98 + 1);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end
            ((iterator *)local_138,(Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_f8);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>>
            ((internal *)local_118,"matrix_const.lower_bound(0, 2)","matrix_const[0].end()",
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_158,
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_138);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fa,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_110,pbStack_110);
  }
  local_118 = (undefined1  [8])0x1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_f0;
  _local_f8 = (value_type)(auVar7 << 0x40);
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)local_118,(size_t *)local_f8);
  local_100 = (pointer)CONCAT44(local_100._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"matrix_const.lower_bound(1, 0).i_row()","1",&local_148,
             (int *)&local_100);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fc,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_118 = (undefined1  [8])0x1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_f0;
  _local_f8 = (value_type)(auVar8 << 0x40);
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)local_118,(size_t *)local_f8);
  local_100 = (pointer)((ulong)local_100 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"matrix_const.lower_bound(1, 0).i_column()","0",
             (unsigned_long *)local_158,(int *)&local_100);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fd,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_118 = (undefined1  [8])0x1;
  local_f8 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)local_118,(size_t *)local_f8);
  local_100 = (pointer)CONCAT44(local_100._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"matrix_const.lower_bound(1, 1).i_row()","1",&local_148,
             (int *)&local_100);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1fe,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_118 = (undefined1  [8])0x1;
  local_f8 = (undefined1  [8])0x1;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)local_118,(size_t *)local_f8);
  local_100 = (pointer)CONCAT44(local_100._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"matrix_const.lower_bound(1, 1).i_column()","2",
             (unsigned_long *)local_158,(int *)&local_100);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x1ff,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_118 = (undefined1  [8])0x1;
  local_f8 = (undefined1  [8])0x2;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)local_118,(size_t *)local_f8);
  local_100 = (pointer)CONCAT44(local_100._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"matrix_const.lower_bound(1, 2).i_row()","1",&local_148,
             (int *)&local_100);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x200,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_118 = (undefined1  [8])0x1;
  local_f8 = (undefined1  [8])0x2;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)local_118,(size_t *)local_f8);
  local_100 = (pointer)CONCAT44(local_100._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_138,"matrix_const.lower_bound(1, 2).i_column()","2",
             (unsigned_long *)local_158,(int *)&local_100);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x201,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_130,pbStack_130);
  }
  local_100 = (pointer)0x2;
  local_98[0] = 0;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)&local_100,local_98);
  local_98[1] = 2;
  _local_f8 = Disa::Matrix_Sparse::operator[](&local_e8,local_98 + 1);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end
            ((iterator *)local_138,(Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_f8);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>>
            ((internal *)local_118,"matrix_const.lower_bound(2, 0)","matrix_const[2].end()",
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_158,
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_138);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x203,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_110,pbStack_110);
  }
  local_100 = (pointer)0x3;
  local_98[0] = 3;
  Disa::Matrix_Sparse::lower_bound
            ((const_iterator_element *)local_158,&local_e8,(size_t *)&local_100,local_98);
  _local_f8 = (value_type)Disa::Matrix_Sparse::end(&local_e8);
  Disa::Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end
            ((iterator *)local_138,(Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_f8);
  testing::internal::
  CmpHelperEQ<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>,Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse_const>>
            ((internal *)local_118,"matrix_const.lower_bound(3, 3)","(*matrix_const.end()).end()",
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_158,
             (Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_138);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (pbStack_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x204,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_158 + 8))();
    }
  }
  if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_110,pbStack_110);
  }
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_e8);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_88);
  return;
}

Assistant:

TEST(test_matrix_sparse, lower_bound) {
  Matrix_Sparse matrix({0, 1, 3, 3}, {1, 0, 2}, {3.0, 4.0, 5.0}, 3);
  EXPECT_EQ(matrix.lower_bound(0, 0).i_row(), 0);
  EXPECT_EQ(matrix.lower_bound(0, 0).i_column(), 1);
  EXPECT_EQ(matrix.lower_bound(0, 1).i_row(), 0);
  EXPECT_EQ(matrix.lower_bound(0, 1).i_column(), 1);
  EXPECT_EQ(matrix.lower_bound(0, 2), matrix[0].end());

  EXPECT_EQ(matrix.lower_bound(1, 0).i_row(), 1);
  EXPECT_EQ(matrix.lower_bound(1, 0).i_column(), 0);
  EXPECT_EQ(matrix.lower_bound(1, 1).i_row(), 1);
  EXPECT_EQ(matrix.lower_bound(1, 1).i_column(), 2);
  EXPECT_EQ(matrix.lower_bound(1, 2).i_row(), 1);
  EXPECT_EQ(matrix.lower_bound(1, 2).i_column(), 2);

  EXPECT_EQ(matrix.lower_bound(2, 0), matrix[2].end());
  EXPECT_EQ(matrix.lower_bound(3, 3), matrix.end()->end());

  const Matrix_Sparse matrix_const({0, 1, 3, 3}, {1, 0, 2}, {3.0, 4.0, 5.0}, 3);
  EXPECT_EQ(matrix_const.lower_bound(0, 0).i_row(), 0);
  EXPECT_EQ(matrix_const.lower_bound(0, 0).i_column(), 1);
  EXPECT_EQ(matrix_const.lower_bound(0, 1).i_row(), 0);
  EXPECT_EQ(matrix_const.lower_bound(0, 1).i_column(), 1);
  EXPECT_EQ(matrix_const.lower_bound(0, 2), matrix_const[0].end());

  EXPECT_EQ(matrix_const.lower_bound(1, 0).i_row(), 1);
  EXPECT_EQ(matrix_const.lower_bound(1, 0).i_column(), 0);
  EXPECT_EQ(matrix_const.lower_bound(1, 1).i_row(), 1);
  EXPECT_EQ(matrix_const.lower_bound(1, 1).i_column(), 2);
  EXPECT_EQ(matrix_const.lower_bound(1, 2).i_row(), 1);
  EXPECT_EQ(matrix_const.lower_bound(1, 2).i_column(), 2);

  EXPECT_EQ(matrix_const.lower_bound(2, 0), matrix_const[2].end());
  EXPECT_EQ(matrix_const.lower_bound(3, 3), (*matrix_const.end()).end());
}